

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format_newc.c
# Opt level: O0

uint32_t from_hex(char *p,size_t l)

{
  int iVar1;
  undefined4 local_1c;
  size_t sStack_18;
  uint32_t r;
  size_t l_local;
  char *p_local;
  
  local_1c = 0;
  l_local = (size_t)p;
  for (sStack_18 = l; sStack_18 != 0; sStack_18 = sStack_18 - 1) {
    if ((*(char *)l_local < 'a') || ('f' < *(char *)l_local)) {
      if ((*(char *)l_local < 'A') || ('F' < *(char *)l_local)) {
        iVar1 = *(char *)l_local + -0x30;
      }
      else {
        iVar1 = *(char *)l_local + -0x37;
      }
    }
    else {
      iVar1 = *(char *)l_local + -0x57;
    }
    local_1c = iVar1 + local_1c * 0x10;
    l_local = l_local + 1;
  }
  return local_1c;
}

Assistant:

static uint32_t
from_hex(const char *p, size_t l)
{
	uint32_t r = 0;

	while (l > 0) {
		r *= 16;
		if (*p >= 'a' && *p <= 'f')
			r += *p + 10 - 'a';
		else if (*p >= 'A' && *p <= 'F')
			r += *p + 10 - 'A';
		else
			r += *p - '0';
		--l;
		++p;
	}
	return (r);
}